

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

int64_t __thiscall
TPZSkylMatrix<std::complex<double>_>::Size
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t column)

{
  complex<double> **ppcVar1;
  
  ppcVar1 = (this->fElem).fStore;
  return (long)ppcVar1[column + 1] - (long)ppcVar1[column] >> 4;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}